

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraBddThresh.c
# Opt level: O0

void Extra_ThreshHeuristicTest(void)

{
  int T_00;
  word *pT;
  word t;
  int Weights [16];
  int T;
  int nVars;
  
  pT = (word *)(s_Truths6[0] & s_Truths6[1] & s_Truths6[2] |
                s_Truths6[0] & s_Truths6[1] & s_Truths6[3] |
                s_Truths6[0] & s_Truths6[1] & s_Truths6[4] & s_Truths6[5] |
               s_Truths6[0] & s_Truths6[2] & s_Truths6[3] & s_Truths6[4] & s_Truths6[5]);
  T_00 = Extra_ThreshHeuristic((word *)&pT,6,(int *)&t);
  Extra_ThreshPrintWeights(T_00,(int *)&t,6);
  return;
}

Assistant:

void Extra_ThreshHeuristicTest() {
	int nVars = 6;
	int T, Weights[16];

	//	word t = 19983902376700760000;
	word t = (s_Truths6[0] & s_Truths6[1] & s_Truths6[2])| (s_Truths6[0] & s_Truths6[1] & s_Truths6[3]) | (s_Truths6[0] & s_Truths6[1] & s_Truths6[4] & s_Truths6[5]) | (s_Truths6[0] & s_Truths6[2] & s_Truths6[3] & s_Truths6[4] & s_Truths6[5]);
	word * pT = &t;
	T = Extra_ThreshHeuristic(pT, nVars, Weights);
	Extra_ThreshPrintWeights(T, Weights, nVars);

}